

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

int __thiscall
cmCTestCoverageHandler::HandleTracePyCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  bool bVar2;
  byte bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  ulong uVar4;
  ostream *poVar5;
  char *pcVar6;
  mapped_type *this_00;
  void *this_01;
  size_type sVar7;
  reference pvVar8;
  value_type_conflict2 local_f64;
  ulong local_f60;
  long lineIdx;
  undefined1 local_f38 [8];
  ostringstream cmCTestLog_msg_6;
  int local_dbc;
  string local_db8 [4];
  int cov;
  undefined1 local_d98 [8];
  ostringstream cmCTestLog_msg_5;
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [8];
  string prefix;
  string nl;
  long cnt;
  undefined1 local_b78 [8];
  ostringstream cmCTestLog_msg_4;
  long local_a00;
  ifstream ifile;
  string local_7f8 [32];
  undefined1 local_7d8 [8];
  ostringstream cmCTestLog_msg_3;
  SingleFileCoverageVector *vec;
  undefined1 local_638 [8];
  ostringstream cmCTestLog_msg_2;
  undefined1 local_4c0 [8];
  string actualSourceFile;
  undefined1 local_480 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_308 [8];
  string fileName;
  string *file;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_2c0 [4];
  int file_count;
  string tempDir;
  undefined1 local_280 [8];
  string testingDir;
  string local_258 [32];
  undefined1 local_238 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string daGlob;
  undefined1 local_78 [8];
  Glob gl;
  cmCTestCoverageHandlerContainer *cont_local;
  cmCTestCoverageHandler *this_local;
  
  gl._80_8_ = cont;
  cmsys::Glob::Glob((Glob *)local_78);
  cmsys::Glob::RecurseOn((Glob *)local_78);
  cmsys::Glob::RecurseThroughSymlinksOff((Glob *)local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (gl._80_8_ + 0x28),"/*.cover");
  cmsys::Glob::FindFiles
            ((Glob *)local_78,
             (string *)
             &files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_c0,__x);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c0);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    poVar5 = std::operator<<((ostream *)local_238," Cannot find any Python Trace.py coverage files."
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x680,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_258);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    this_local._4_4_ = 0;
    testingDir.field_2._12_4_ = 1;
  }
  else {
    cmCTest::GetBinaryDir_abi_cxx11_
              ((string *)((long)&tempDir.field_2 + 8),(this->super_cmCTestGenericHandler).CTest);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&tempDir.field_2 + 8),"/Testing");
    std::__cxx11::string::~string((string *)(tempDir.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280,
                   "/CoverageInfo");
    cmsys::SystemTools::MakeDirectory((string *)local_2c0,(mode_t *)0x0);
    __range1._4_4_ = 0;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_c0);
    file = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c0);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&file), bVar2) {
      fileName.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      FindFile((string *)local_308,this,(cmCTestCoverageHandlerContainer *)gl._80_8_,
               (string *)fileName.field_2._8_8_);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        cmsys::SystemTools::CollapseFullPath((string *)local_4c0,(string *)local_308);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_638);
        poVar5 = std::operator<<((ostream *)local_638,"   Check coverage for file: ");
        poVar5 = std::operator<<(poVar5,(string *)local_4c0);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x697,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&vec);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_638);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                *)(gl._80_8_ + 0x48),(key_type *)local_4c0);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7d8);
        poVar5 = std::operator<<((ostream *)local_7d8,"   in file: ");
        poVar5 = std::operator<<(poVar5,(string *)fileName.field_2._8_8_);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x69b,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_7f8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7d8);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        std::ifstream::ifstream(&local_a00,pcVar6,_S_in);
        bVar3 = std::ios::operator!((ios *)((long)&local_a00 + *(long *)(local_a00 + -0x18)));
        if ((bVar3 & 1) == 0) {
          nl.field_2._8_8_ = 0xffffffffffffffff;
          std::__cxx11::string::string((string *)(prefix.field_2._M_local_buf + 8));
          while (bVar2 = cmsys::SystemTools::GetLineFromStream
                                   ((istream *)&local_a00,(string *)((long)&prefix.field_2 + 8),
                                    (bool *)0x0,-1), bVar2) {
            nl.field_2._8_8_ = nl.field_2._8_8_ + 1;
            uVar4 = std::__cxx11::string::empty();
            if (((uVar4 & 1) == 0) && (uVar4 = std::__cxx11::string::size(), 0xb < uVar4)) {
              std::__cxx11::string::substr((ulong)local_be0,(ulong)((long)&prefix.field_2 + 8));
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_be0);
              if ((*pcVar6 != ' ') &&
                 (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_be0),
                 *pcVar6 != ':')) {
                std::__cxx11::string::substr((ulong)local_c00,(ulong)((long)&prefix.field_2 + 8));
                std::__cxx11::string::operator=(local_be0,local_c00);
                std::__cxx11::string::~string(local_c00);
                pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_be0);
                if ((*pcVar6 != ' ') &&
                   (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_be0),
                   *pcVar6 != ':')) {
                  std::__cxx11::string::substr((ulong)local_c20,(ulong)((long)&prefix.field_2 + 8));
                  std::__cxx11::string::operator=(local_be0,local_c20);
                  std::__cxx11::string::~string(local_c20);
                  pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_be0);
                  if ((*pcVar6 != ' ') &&
                     (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_be0),
                     *pcVar6 != ':')) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d98);
                    poVar5 = std::operator<<((ostream *)local_d98,
                                             "Currently the limit is maximum coverage of 999999");
                    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                    std::__cxx11::ostringstream::str();
                    pcVar6 = (char *)std::__cxx11::string::c_str();
                    cmCTest::Log(pcVar1,7,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                                 ,0x6bb,pcVar6,false);
                    std::__cxx11::string::~string(local_db8);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d98);
                  }
                }
              }
              pcVar6 = (char *)std::__cxx11::string::c_str();
              local_dbc = atoi(pcVar6);
              std::__cxx11::string::size();
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_be0);
              if (*pcVar6 != ':') {
                local_dbc = 0;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f38);
              poVar5 = std::operator<<((ostream *)local_f38,"Prefix: ");
              poVar5 = std::operator<<(poVar5,local_be0);
              poVar5 = std::operator<<(poVar5," cov: ");
              this_01 = (void *)std::ostream::operator<<(poVar5,local_dbc);
              std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar6 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,0,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                           ,0x6c8,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
              std::__cxx11::string::~string((string *)&lineIdx);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f38);
              local_f60 = nl.field_2._8_8_;
              if (-1 < (long)nl.field_2._8_8_) {
                while (sVar7 = std::vector<int,_std::allocator<int>_>::size(this_00),
                      sVar7 <= local_f60) {
                  local_f64 = -1;
                  std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_f64);
                }
                pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](this_00,local_f60);
                if ((*pvVar8 < 0) && (-1 < local_dbc)) {
                  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](this_00,local_f60);
                  *pvVar8 = 0;
                }
                pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](this_00,local_f60);
                *pvVar8 = local_dbc + *pvVar8;
              }
              std::__cxx11::string::~string(local_be0);
            }
          }
          std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b78);
          poVar5 = std::operator<<((ostream *)local_b78,"Cannot open file: ");
          poVar5 = std::operator<<(poVar5,(string *)fileName.field_2._8_8_);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x69f,pcVar6,false);
          std::__cxx11::string::~string((string *)&cnt);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b78);
        }
        __range1._4_4_ = __range1._4_4_ + 1;
        std::ifstream::~ifstream(&local_a00);
        std::__cxx11::string::~string((string *)local_4c0);
        testingDir.field_2._12_4_ = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_480);
        poVar5 = std::operator<<((ostream *)local_480,
                                 "Cannot find source Python file corresponding to: ");
        poVar5 = std::operator<<(poVar5,(string *)fileName.field_2._8_8_);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x68f,pcVar6,false);
        std::__cxx11::string::~string((string *)(actualSourceFile.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_480);
        testingDir.field_2._12_4_ = 5;
      }
      std::__cxx11::string::~string((string *)local_308);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    this_local._4_4_ = __range1._4_4_;
    testingDir.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_2c0);
    std::__cxx11::string::~string((string *)local_280);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c0);
  std::__cxx11::string::~string
            ((string *)
             &files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmsys::Glob::~Glob((Glob *)local_78);
  return this_local._4_4_;
}

Assistant:

int cmCTestCoverageHandler::HandleTracePyCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  cmsys::Glob gl;
  gl.RecurseOn();
  gl.RecurseThroughSymlinksOff();
  std::string daGlob = cont->BinaryDir + "/*.cover";
  gl.FindFiles(daGlob);
  std::vector<std::string> files = gl.GetFiles();

  if (files.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       " Cannot find any Python Trace.py coverage files."
                         << std::endl,
                       this->Quiet);
    // No coverage files is a valid thing, so the exit code is 0
    return 0;
  }

  std::string testingDir = this->CTest->GetBinaryDir() + "/Testing";
  std::string tempDir = testingDir + "/CoverageInfo";
  cmSystemTools::MakeDirectory(tempDir);

  int file_count = 0;
  for (std::string const& file : files) {
    std::string fileName = this->FindFile(cont, file);
    if (fileName.empty()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot find source Python file corresponding to: "
                   << file << std::endl);
      continue;
    }

    std::string actualSourceFile = cmSystemTools::CollapseFullPath(fileName);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "   Check coverage for file: " << actualSourceFile
                                                      << std::endl,
                       this->Quiet);
    cmCTestCoverageHandlerContainer::SingleFileCoverageVector* vec =
      &cont->TotalCoverage[actualSourceFile];
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "   in file: " << file << std::endl, this->Quiet);
    cmsys::ifstream ifile(file.c_str());
    if (!ifile) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot open file: " << file << std::endl);
    } else {
      long cnt = -1;
      std::string nl;
      while (cmSystemTools::GetLineFromStream(ifile, nl)) {
        cnt++;

        // Skip empty lines
        if (nl.empty()) {
          continue;
        }

        // Skip unused lines
        if (nl.size() < 12) {
          continue;
        }

        // Read the coverage count from the beginning of the Trace.py output
        // line
        std::string prefix = nl.substr(0, 6);
        if (prefix[5] != ' ' && prefix[5] != ':') {
          // This is a hack. We should really do something more elaborate
          prefix = nl.substr(0, 7);
          if (prefix[6] != ' ' && prefix[6] != ':') {
            prefix = nl.substr(0, 8);
            if (prefix[7] != ' ' && prefix[7] != ':') {
              cmCTestLog(this->CTest, ERROR_MESSAGE,
                         "Currently the limit is maximum coverage of 999999"
                           << std::endl);
            }
          }
        }
        int cov = atoi(prefix.c_str());
        if (prefix[prefix.size() - 1] != ':') {
          // This line does not have ':' so no coverage here. That said,
          // Trace.py does not handle not covered lines versus comments etc.
          // So, this will be set to 0.
          cov = 0;
        }
        cmCTestOptionalLog(
          this->CTest, DEBUG,
          "Prefix: " << prefix << " cov: " << cov << std::endl, this->Quiet);
        // Read the line number starting at the 10th character of the gcov
        // output line
        long lineIdx = cnt;
        if (lineIdx >= 0) {
          while (vec->size() <= static_cast<size_t>(lineIdx)) {
            vec->push_back(-1);
          }
          // Initially all entries are -1 (not used). If we get coverage
          // information, increment it to 0 first.
          if ((*vec)[lineIdx] < 0) {
            if (cov >= 0) {
              (*vec)[lineIdx] = 0;
            }
          }
          (*vec)[lineIdx] += cov;
        }
      }
    }
    ++file_count;
  }
  return file_count;
}